

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

unsigned_long crc32_big(unsigned_long crc,uchar *buf,z_size_t len)

{
  uint uVar1;
  uint *puVar2;
  uint *local_30;
  z_crc_t *buf4;
  ulong uStack_20;
  z_crc_t c;
  z_size_t len_local;
  uchar *buf_local;
  unsigned_long crc_local;
  
  buf4._4_4_ = ((uint)(crc >> 0x18) & 0xff) + ((uint)(crc >> 8) & 0xff00) +
               ((uint)crc & 0xff00) * 0x100 + (uint)crc * 0x1000000 ^ 0xffffffff;
  len_local = (z_size_t)buf;
  for (uStack_20 = len; uStack_20 != 0 && (len_local & 3) != 0; uStack_20 = uStack_20 - 1) {
    buf4._4_4_ = crc_table[4][buf4._4_4_ >> 0x18 ^ (uint)*(byte *)len_local] ^ buf4._4_4_ << 8;
    len_local = len_local + 1;
  }
  local_30 = (uint *)len_local;
  for (; 0x1f < uStack_20; uStack_20 = uStack_20 - 0x20) {
    uVar1 = *local_30 ^ buf4._4_4_;
    uVar1 = local_30[1] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    uVar1 = local_30[2] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    uVar1 = local_30[3] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    uVar1 = local_30[4] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    uVar1 = local_30[5] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    puVar2 = local_30 + 7;
    uVar1 = local_30[6] ^
            crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
            crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    local_30 = local_30 + 8;
    uVar1 = *puVar2 ^ crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
                      crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    buf4._4_4_ = crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
                 crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
  }
  for (; 3 < uStack_20; uStack_20 = uStack_20 - 4) {
    uVar1 = *local_30 ^ buf4._4_4_;
    buf4._4_4_ = crc_table[4][uVar1 & 0xff] ^ crc_table[5][uVar1 >> 8 & 0xff] ^
                 crc_table[6][uVar1 >> 0x10 & 0xff] ^ crc_table[7][uVar1 >> 0x18];
    local_30 = local_30 + 1;
  }
  for (; uStack_20 != 0; uStack_20 = uStack_20 - 1) {
    buf4._4_4_ = crc_table[4][buf4._4_4_ >> 0x18 ^ (uint)(byte)*local_30] ^ buf4._4_4_ << 8;
    local_30 = (uint *)((long)local_30 + 1);
  }
  uVar1 = buf4._4_4_ ^ 0xffffffff;
  return (ulong)((uVar1 >> 0x18) + (uVar1 >> 8 & 0xff00) + (uVar1 & 0xff00) * 0x100 +
                uVar1 * 0x1000000);
}

Assistant:

local unsigned long crc32_big(crc, buf, len)
    unsigned long crc;
    const unsigned char FAR *buf;
    z_size_t len;
{
    register z_crc_t c;
    register const z_crc_t FAR *buf4;

    c = ZSWAP32((z_crc_t)crc);
    c = ~c;
    while (len && ((ptrdiff_t)buf & 3)) {
        c = crc_table[4][(c >> 24) ^ *buf++] ^ (c << 8);
        len--;
    }

    buf4 = (const z_crc_t FAR *)(const void FAR *)buf;
    while (len >= 32) {
        DOBIG32;
        len -= 32;
    }
    while (len >= 4) {
        DOBIG4;
        len -= 4;
    }
    buf = (const unsigned char FAR *)buf4;

    if (len) do {
        c = crc_table[4][(c >> 24) ^ *buf++] ^ (c << 8);
    } while (--len);
    c = ~c;
    return (unsigned long)(ZSWAP32(c));
}